

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<unsigned_int>::clear(QList<unsigned_int> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QPodArrayOps<unsigned_int> *this_00;
  __off_t __length;
  QArrayDataPointer<unsigned_int> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<unsigned_int> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<unsigned_int> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<unsigned_int> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<unsigned_int>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<unsigned_int>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<unsigned_int> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<unsigned_int>::allocatedCapacity(in_RDI);
      QArrayDataPointer<unsigned_int>::QArrayDataPointer
                (pQVar4,(qsizetype)alloc,(qsizetype)n,option);
      QArrayDataPointer<unsigned_int>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<unsigned_int>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QPodArrayOps<unsigned_int> *)QArrayDataPointer<unsigned_int>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<unsigned_int>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }